

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

void __thiscall
absl::str_format_internal::anon_unknown_0::FormatFPositiveExpSlow
          (anon_unknown_0 *this,uint128 v,int exp,FormatState *state)

{
  undefined4 in_register_0000000c;
  Func f;
  undefined8 local_40;
  undefined8 *local_38;
  code *local_30;
  anon_unknown_0 *local_28;
  uint64_t local_20;
  uint local_18;
  
  local_40 = CONCAT44(in_register_0000000c,exp);
  local_20 = v.lo_;
  local_18 = (uint)v.hi_;
  if ((int)local_18 < 1) {
    __assert_fail("exp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x90,
                  "static void absl::str_format_internal::(anonymous namespace)::BinaryToDecimal::RunConversion(uint128, int, absl::FunctionRef<void (BinaryToDecimal)>)"
                 );
  }
  if (local_18 < 0x4001) {
    local_38 = &local_40;
    local_30 = functional_internal::
               InvokeObject<absl::str_format_internal::(anonymous_namespace)::FormatFPositiveExpSlow(absl::uint128,int,absl::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0,void,absl::str_format_internal::(anonymous_namespace)::BinaryToDecimal>
    ;
    f.invoker_ = (Invoker<void,_absl::Span<unsigned_int>_>)&local_38;
    f.ptr_.fun = functional_internal::
                 InvokeObject<absl::str_format_internal::(anonymous_namespace)::BinaryToDecimal::RunConversion(absl::uint128,int,absl::FunctionRef<void(absl::str_format_internal::(anonymous_namespace)::BinaryToDecimal)>)::_lambda(absl::Span<unsigned_int>)_1_,void,absl::Span<unsigned_int>>
    ;
    local_28 = this;
    StackArray::RunWithCapacity
              ((StackArray *)(ulong)(ushort)(((local_18 + 0x9f >> 5) * 0xb & 0xffff) / 10),
               (size_t)&local_38,f);
    return;
  }
  __assert_fail("exp <= std::numeric_limits<MaxFloatType>::max_exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0x91,
                "static void absl::str_format_internal::(anonymous namespace)::BinaryToDecimal::RunConversion(uint128, int, absl::FunctionRef<void (BinaryToDecimal)>)"
               );
}

Assistant:

void FormatFPositiveExpSlow(uint128 v, int exp, const FormatState &state) {
  BinaryToDecimal::RunConversion(v, exp, [&](BinaryToDecimal btd) {
    const size_t total_digits =
        btd.TotalDigits() + (state.ShouldPrintDot() ? state.precision + 1 : 0);

    const auto padding = ExtraWidthToPadding(
        total_digits + (state.sign_char != '\0' ? 1 : 0), state);

    state.sink->Append(padding.left_spaces, ' ');
    if (state.sign_char != '\0')
      state.sink->Append(1, state.sign_char);
    state.sink->Append(padding.zeros, '0');

    do {
      state.sink->Append(btd.CurrentDigits());
    } while (btd.AdvanceDigits());

    if (state.ShouldPrintDot())
      state.sink->Append(1, '.');
    state.sink->Append(state.precision, '0');
    state.sink->Append(padding.right_spaces, ' ');
  });
}